

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
          (TermSubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,LeafData *d,
          bool insert)

{
  byte in_DL;
  long in_RDI;
  bool in_stack_000000e7;
  LeafData *in_stack_000000e8;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *in_stack_000000f0;
  Lhs local_48;
  byte local_11;
  
  local_11 = in_DL & 1;
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(&local_48,(Lhs *)(in_RDI + 8));
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e7);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3dd134);
  return;
}

Assistant:

void handle(LeafData d, bool insert) final override
  { _inner.handle(std::move(d), insert); }